

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O2

UBool __thiscall
icu_63::Normalizer2Impl::hasCompBoundaryBefore(Normalizer2Impl *this,UChar *src,UChar *limit)

{
  UChar UVar1;
  UChar UVar2;
  UBool UVar3;
  int iVar4;
  UCPTrie *trie;
  
  if ((src != limit) && (UVar1 = *src, (ushort)this->minCompNoMaybeCP <= (ushort)UVar1)) {
    if ((UVar1 & 0xf800U) == 0xd800) {
      if ((src + 1 == limit || ((byte)((ushort)UVar1 >> 10) & 1) != 0) ||
         (UVar2 = src[1], (UVar2 & 0xfc00U) != 0xdc00)) {
        trie = this->normTrie;
        iVar4 = trie->dataLength + -1;
      }
      else {
        iVar4 = (uint)(ushort)UVar1 * 0x400 + (uint)(ushort)UVar2 + -0x35fdc00;
        trie = this->normTrie;
        if (iVar4 < trie->highStart) {
          iVar4 = ucptrie_internalSmallIndex_63(trie,iVar4);
          trie = this->normTrie;
        }
        else {
          iVar4 = trie->dataLength + -2;
        }
      }
    }
    else {
      trie = this->normTrie;
      iVar4 = ((ushort)UVar1 & 0x3f) + (uint)trie->index[(ushort)UVar1 >> 6];
    }
    UVar3 = norm16HasCompBoundaryBefore
                      (this,*(uint16_t *)((long)(trie->data).ptr0 + (long)iVar4 * 2));
    return UVar3;
  }
  return '\x01';
}

Assistant:

UBool Normalizer2Impl::hasCompBoundaryBefore(const UChar *src, const UChar *limit) const {
    if (src == limit || *src < minCompNoMaybeCP) {
        return TRUE;
    }
    UChar32 c;
    uint16_t norm16;
    UCPTRIE_FAST_U16_NEXT(normTrie, UCPTRIE_16, src, limit, c, norm16);
    return norm16HasCompBoundaryBefore(norm16);
}